

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::LineCase::verifyImage
          (LineCase *this,ConstPixelBufferAccess *testImageAccess,
          ConstPixelBufferAccess *referenceImageAccess)

{
  float fVar1;
  size_t sVar2;
  ConstPixelBufferAccess *ref;
  ConstPixelBufferAccess *test;
  int iVar3;
  RenderTarget *this_00;
  MessageBuilder *pMVar4;
  TestLog *pTVar5;
  MessageBuilder local_b60;
  ConstPixelBufferAccess local_9e0;
  allocator<char> local_9b1;
  string local_9b0;
  allocator<char> local_989;
  string local_988;
  LogImage local_968;
  allocator<char> local_8d1;
  string local_8d0;
  allocator<char> local_8a9;
  string local_8a8;
  LogImage local_888;
  allocator<char> local_7f1;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  LogImage local_7a8;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  LogImageSet local_6c8;
  MessageBuilder local_688;
  PixelBufferAccess local_508;
  MessageBuilder local_4e0;
  MessageBuilder local_360;
  MessageBuilder local_1d0;
  undefined1 local_50 [8];
  Surface diffMask;
  TestLog *log;
  int local_28;
  int iStack_24;
  bool isMsaa;
  int faultyPixels;
  int faultyLimit;
  ConstPixelBufferAccess *referenceImageAccess_local;
  ConstPixelBufferAccess *testImageAccess_local;
  LineCase *this_local;
  
  iStack_24 = 6;
  _faultyPixels = referenceImageAccess;
  referenceImageAccess_local = testImageAccess;
  testImageAccess_local = (ConstPixelBufferAccess *)this;
  this_00 = gles3::Context::getRenderTarget
                      ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.
                       m_context);
  iVar3 = tcu::RenderTarget::getNumSamples(this_00);
  diffMask.m_pixels.m_cap =
       (size_t)tcu::TestContext::getLog
                         ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.
                          super_TestCase.super_TestNode.m_testCtx);
  tcu::Surface::Surface((Surface *)local_50,200,200);
  tcu::TestLog::operator<<
            (&local_1d0,(TestLog *)diffMask.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [21])"Comparing images... ");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  tcu::TestLog::operator<<
            (&local_360,(TestLog *)diffMask.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [28])"Deviation within radius of ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_searchKernelSize);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])0x2c1da6c);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_360);
  tcu::TestLog::operator<<
            (&local_4e0,(TestLog *)diffMask.m_pixels.m_cap,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_4e0,&stack0xffffffffffffffdc);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [28])" faulty pixels are allowed.");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4e0);
  test = referenceImageAccess_local;
  ref = _faultyPixels;
  sVar2 = diffMask.m_pixels.m_cap;
  tcu::Surface::getAccess(&local_508,(Surface *)local_50);
  local_28 = compareBlackNonBlackImages
                       ((TestLog *)sVar2,test,ref,&local_508,this->m_searchKernelSize);
  sVar2 = diffMask.m_pixels.m_cap;
  if (6 < local_28) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"Images",&local_6e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_710,"Image comparison",&local_711);
    tcu::LogImageSet::LogImageSet(&local_6c8,&local_6e8,&local_710);
    pTVar5 = tcu::TestLog::operator<<((TestLog *)sVar2,&local_6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"TestImage",&local_7c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"Test image",&local_7f1)
    ;
    tcu::LogImage::LogImage
              (&local_7a8,&local_7c8,&local_7f0,referenceImageAccess_local,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_7a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a8,"ReferenceImage",&local_8a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d0,"Reference image",&local_8d1);
    tcu::LogImage::LogImage
              (&local_888,&local_8a8,&local_8d0,_faultyPixels,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_888);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_988,"DifferenceMask",&local_989);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b0,"Difference mask",&local_9b1);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_9e0,(Surface *)local_50);
    tcu::LogImage::LogImage
              (&local_968,&local_988,&local_9b0,&local_9e0,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_968);
    pTVar5 = tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::TestLog::operator<<(&local_688,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_688,(char (*) [5])0x2c0dbea);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_28);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [18])" faulty pixel(s).");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_688);
    tcu::LogImage::~LogImage(&local_968);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::allocator<char>::~allocator(&local_9b1);
    std::__cxx11::string::~string((string *)&local_988);
    std::allocator<char>::~allocator(&local_989);
    tcu::LogImage::~LogImage(&local_888);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::allocator<char>::~allocator(&local_8d1);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::allocator<char>::~allocator(&local_8a9);
    tcu::LogImage::~LogImage(&local_7a8);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator(&local_7c9);
    tcu::LogImageSet::~LogImageSet(&local_6c8);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator(&local_711);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
    fVar1 = (this->super_LineRenderTestCase).m_lineWidth;
    if (((fVar1 == 1.0) && (!NAN(fVar1))) || (iVar3 < 2)) {
      tcu::TestContext::setTestResult
                ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
    }
    else {
      tcu::TestLog::operator<<
                (&local_b60,(TestLog *)diffMask.m_pixels.m_cap,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_b60,
                          (char (*) [64])
                          "Wide line support is optional, reporting compatibility warning.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_b60);
      tcu::TestContext::setTestResult
                ((this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase
                 .super_TestNode.m_testCtx,QP_TEST_RESULT_COMPATIBILITY_WARNING,
                 "Wide line clipping failed");
    }
  }
  tcu::Surface::~Surface((Surface *)local_50);
  return;
}

Assistant:

void LineCase::verifyImage (const tcu::ConstPixelBufferAccess& testImageAccess, const tcu::ConstPixelBufferAccess& referenceImageAccess)
{
	const int		faultyLimit		= 6;
	int				faultyPixels;

	const bool		isMsaa			= m_context.getRenderTarget().getNumSamples() > 1;
	tcu::TestLog&	log				= m_testCtx.getLog();
	tcu::Surface	diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
	log << TestLog::Message << "Deviation within radius of " << m_searchKernelSize << " is allowed." << TestLog::EndMessage;
	log << TestLog::Message << faultyLimit << " faulty pixels are allowed." << TestLog::EndMessage;

	faultyPixels = compareBlackNonBlackImages(log, testImageAccess, referenceImageAccess, diffMask.getAccess(), m_searchKernelSize);

	if (faultyPixels > faultyLimit)
	{
		log << TestLog::ImageSet("Images", "Image comparison")
			<< TestLog::Image("TestImage", "Test image", testImageAccess)
			<< TestLog::Image("ReferenceImage", "Reference image", referenceImageAccess)
			<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
			<< TestLog::EndImageSet
			<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

		if (m_lineWidth != 1.0f && isMsaa)
		{
			log << TestLog::Message << "Wide line support is optional, reporting compatibility warning." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Wide line clipping failed");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
	}
}